

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O2

bool __thiscall
DyndepLoader::LoadDyndepFile(DyndepLoader *this,Node *file,DyndepFile *ddf,string *err)

{
  bool bVar1;
  DyndepParser parser;
  DyndepParser DStack_d8;
  
  DyndepParser::DyndepParser(&DStack_d8,this->state_,(FileReader *)this->disk_interface_,ddf);
  bVar1 = Parser::Load(&DStack_d8.super_Parser,&file->path_,err,(Lexer *)0x0);
  DyndepParser::~DyndepParser(&DStack_d8);
  return bVar1;
}

Assistant:

bool DyndepLoader::LoadDyndepFile(Node* file, DyndepFile* ddf,
                                  std::string* err) const {
  DyndepParser parser(state_, disk_interface_, ddf);
  return parser.Load(file->path(), err);
}